

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O2

ostream * wasm::anon_unknown_12::operator<<(ostream *o,Mode *mode)

{
  if ((ulong)*mode < 4) {
    std::operator<<(o,&DAT_001265f0 + *(int *)(&DAT_001265f0 + (ulong)*mode * 4));
  }
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, WasmSplitOptions::Mode& mode) {
  switch (mode) {
    case WasmSplitOptions::Mode::Split:
      o << "split";
      break;
    case WasmSplitOptions::Mode::Instrument:
      o << "instrument";
      break;
    case WasmSplitOptions::Mode::MergeProfiles:
      o << "merge-profiles";
      break;
    case WasmSplitOptions::Mode::PrintProfile:
      o << "print-profile";
      break;
  }
  return o;
}